

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_normalize_space(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  lyxp_set *plVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  ly_bool lVar5;
  LY_ERR LVar6;
  int iVar7;
  ulong uVar8;
  size_t __size;
  void *ptr;
  lyxp_set_node *plVar9;
  char *pcVar10;
  bool bVar11;
  uint uVar12;
  char *format;
  long lVar13;
  LY_ERR ret__;
  byte bVar14;
  undefined4 uVar15;
  ulong uVar16;
  ly_ctx *ctx;
  uint uVar17;
  
  if ((options & 0x1c) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    LVar6 = lyxp_set_cast(set,LYXP_SET_STRING);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    pcVar10 = (set->val).str;
    bVar11 = false;
    uVar8 = 0;
    do {
      while( true ) {
        iVar7 = (int)uVar8;
        uVar8 = (ulong)(byte)pcVar10[uVar8];
        if (uVar8 < 0x21) break;
LAB_001b2e4c:
        uVar8 = (ulong)(iVar7 + 1);
        bVar11 = false;
      }
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 != 0) goto LAB_001b2e4c;
        goto LAB_001b2fec;
      }
      if (bVar11 || iVar7 == 0) break;
      uVar8 = (ulong)(iVar7 + 1);
      bVar11 = true;
    } while (pcVar10[uVar8] != '\0');
    __size = strlen(pcVar10);
    ptr = malloc(__size);
    if (ptr != (void *)0x0) {
      uVar8 = 0;
      bVar11 = false;
      uVar12 = 0;
LAB_001b2e72:
      bVar14 = pcVar10[uVar12];
      uVar16 = (ulong)bVar14;
      uVar17 = (uint)uVar8;
      bVar4 = false;
      if (0x20 < uVar16) {
LAB_001b2e9d:
        bVar11 = bVar4;
        *(byte *)((long)ptr + uVar8) = bVar14;
        uVar8 = (ulong)(uVar17 + 1);
LAB_001b2ea7:
        uVar12 = uVar12 + 1;
        goto LAB_001b2e72;
      }
      if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) {
        bVar14 = 0x20;
        bVar3 = !bVar11;
        bVar11 = true;
        bVar4 = true;
        if (bVar3 && uVar12 != 0) goto LAB_001b2e9d;
        goto LAB_001b2ea7;
      }
      bVar4 = false;
      if (uVar16 != 0) goto LAB_001b2e9d;
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        uVar8 = (ulong)*(byte *)((long)ptr + (ulong)(uVar17 - 1));
        if ((uVar8 < 0x21) && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0)) {
          uVar17 = uVar17 - 1;
        }
      }
      plVar9 = (lyxp_set_node *)ly_realloc(ptr,(ulong)(uVar17 + 1));
      if (plVar9 != (lyxp_set_node *)0x0) {
        *(undefined1 *)((long)&plVar9->node + (ulong)uVar17) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar9;
        goto LAB_001b2fec;
      }
    }
    LVar6 = LY_EMEM;
    ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_normalize_space");
  }
  else {
    if ((arg_count != 0) && (plVar1 = *args, plVar1->type == LYXP_SET_SCNODE_SET)) {
      uVar12 = plVar1->used;
      do {
        uVar12 = uVar12 - 1;
        if (*(int *)((long)(plVar1->val).nodes + (ulong)uVar12 * 0x18 + 0xc) == 2) {
          puVar2 = *(ushort **)((long)(plVar1->val).nodes + (ulong)uVar12 * 0x18);
          if (puVar2 == (ushort *)0x0) break;
          if ((*puVar2 & 0xc) == 0) {
            ctx = set->ctx;
            pcVar10 = lys_nodetype2str(*puVar2);
            format = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar5 = warn_is_string_type(*(lysc_type **)(puVar2 + 0x30));
            if (lVar5 != '\0') break;
            ctx = set->ctx;
            pcVar10 = *(char **)(puVar2 + 0x14);
            format = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_normalize_space",pcVar10);
          break;
        }
      } while (uVar12 != 0);
    }
    uVar12 = set->used;
    if ((ulong)uVar12 != 0) {
      lVar13 = 0;
      do {
        iVar7 = *(int *)((long)&((set->val).nodes)->pos + lVar13);
        if (iVar7 == 2) {
          uVar15 = 1;
LAB_001b2fdf:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar13) = uVar15;
        }
        else if (iVar7 == -2) {
          uVar15 = 0xffffffff;
          goto LAB_001b2fdf;
        }
        lVar13 = lVar13 + 0x18;
      } while ((ulong)uVar12 * 0x18 != lVar13);
    }
LAB_001b2fec:
    LVar6 = LY_SUCCESS;
  }
  return LVar6;
}

Assistant:

static LY_ERR
xpath_normalize_space(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i, new_used;
    char *new;
    ly_bool have_spaces = 0, space_before = 0;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    rc = lyxp_set_cast(set, LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return LY_SUCCESS;
}